

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.hpp
# Opt level: O1

string * __thiscall
backend::codegen::format_bb_label_abi_cxx11_
          (string *__return_storage_ptr__,codegen *this,string_view function_name,uint32_t label_id)

{
  ostream *poVar1;
  stringstream s;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,".bb_",4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,(char *)function_name._M_len,(long)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"$",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

inline std::string format_bb_label(std::string_view function_name,
                                   uint32_t label_id) {
  auto s = std::stringstream();
  s << ".bb_" << function_name << "$" << label_id;
  return s.str();
}